

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<ot::commissioner::JoinerType>,testing::Matcher<unsigned_long>>,std::tuple<ot::commissioner::JoinerType,unsigned_long>>
               (tuple<testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_long>_>
                *matcher_tuple,tuple<ot::commissioner::JoinerType,_unsigned_long> *value_tuple)

{
  bool bVar1;
  
  bVar1 = MatcherBase<ot::commissioner::JoinerType>::Matches
                    ((MatcherBase<ot::commissioner::JoinerType> *)
                     &(matcher_tuple->
                      super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_long>_>
                      ).super__Head_base<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_false>
                     ,&(value_tuple->
                       super__Tuple_impl<0UL,_ot::commissioner::JoinerType,_unsigned_long>).
                       super__Head_base<0UL,_ot::commissioner::JoinerType,_false>._M_head_impl);
  if (bVar1) {
    bVar1 = MatcherBase<unsigned_long>::Matches
                      ((MatcherBase<unsigned_long> *)matcher_tuple,(unsigned_long *)value_tuple);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }